

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

CAmount __thiscall
wallet::SelectionResult::GetChange
          (SelectionResult *this,CAmount min_viable_change,CAmount change_fee)

{
  long lVar1;
  CAmount CVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_use_effective == true) {
    CVar2 = GetSelectedEffectiveValue(this);
    lVar3 = CVar2 - (change_fee + this->m_target);
  }
  else {
    CVar2 = GetSelectedValue(this);
    lVar3 = CVar2 - this->m_target;
  }
  lVar4 = 0;
  if (min_viable_change <= lVar3) {
    lVar4 = lVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar4;
  }
  __stack_chk_fail();
}

Assistant:

CAmount SelectionResult::GetChange(const CAmount min_viable_change, const CAmount change_fee) const
{
    // change = SUM(inputs) - SUM(outputs) - fees
    // 1) With SFFO we don't pay any fees
    // 2) Otherwise we pay all the fees:
    //  - input fees are covered by GetSelectedEffectiveValue()
    //  - non_input_fee is included in m_target
    //  - change_fee
    const CAmount change = m_use_effective
                           ? GetSelectedEffectiveValue() - m_target - change_fee
                           : GetSelectedValue() - m_target;

    if (change < min_viable_change) {
        return 0;
    }

    return change;
}